

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QWidget * __thiscall QWidgetPrivate::naturalWidgetFont(QWidgetPrivate *this,uint inheritedMask)

{
  byte bVar1;
  bool bVar2;
  QGraphicsWidget *this_00;
  QFont *pQVar3;
  pointer pQVar4;
  uint in_EDX;
  QWidgetPrivate *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidget *p;
  bool useStyleSheetPropagationInWidgetStyles;
  QWidget *q;
  QFont *naturalFont;
  QFont inheritedFont_1;
  QFont inheritedFont;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  QWidget *this_01;
  undefined4 in_stack_ffffffffffffff90;
  QFont local_58 [16];
  undefined1 *local_48;
  undefined1 *local_40;
  QFont local_38 [16];
  undefined1 *local_28;
  undefined1 *local_20;
  QFont local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  q_func(in_RSI);
  bVar1 = QCoreApplication::testAttribute(AA_UseStyleSheetPropagationInWidgetStyles);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)&in_RDI->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
  QApplication::font((QWidget *)CONCAT44(in_EDX,in_stack_ffffffffffffff90));
  bVar2 = QWidget::testAttribute((QWidget *)in_RSI,(WidgetAttribute)((ulong)this_01 >> 0x20));
  if (((!bVar2) || ((bVar1 & 1) != 0)) &&
     (((bVar2 = QWidget::isWindow(this_01), !bVar2 ||
       (bVar2 = QWidget::testAttribute((QWidget *)in_RSI,(WidgetAttribute)((ulong)this_01 >> 0x20)),
       bVar2)) ||
      ((bVar2 = std::unique_ptr::operator_cast_to_bool
                          ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36cf45), bVar2 &&
       (pQVar4 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36cf5c),
       pQVar4->proxyWidget != (QGraphicsProxyWidget *)0x0)))))) {
    this_00 = (QGraphicsWidget *)QWidget::parentWidget((QWidget *)0x36cf71);
    if (this_00 == (QGraphicsWidget *)0x0) {
      bVar2 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36d0a0);
      if (((bVar2) &&
          (pQVar4 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36d0b7),
          pQVar4->proxyWidget != (QGraphicsProxyWidget *)0x0)) && (in_EDX != 0)) {
        local_48 = &DAT_aaaaaaaaaaaaaaaa;
        local_40 = &DAT_aaaaaaaaaaaaaaaa;
        std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                  ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x36d0ef);
        QGraphicsWidget::font(this_00);
        QFont::setResolveMask((QFont *)&local_48,in_EDX);
        QFont::resolve(local_58);
        QFont::operator=((QFont *)this_01,
                         (QFont *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
        QFont::~QFont(local_58);
        QFont::~QFont((QFont *)&local_48);
      }
    }
    else {
      bVar2 = QWidget::testAttribute((QWidget *)in_RSI,(WidgetAttribute)((ulong)this_01 >> 0x20));
      if ((!bVar2) || ((bVar1 & 1) != 0)) {
        QApplication::font();
        bVar1 = QFont::isCopyOf((QFont *)in_RDI);
        bVar1 = bVar1 ^ 0xff;
        QFont::~QFont(local_18);
        if ((bVar1 & 1) == 0) {
          pQVar3 = QWidget::font((QWidget *)this_00);
          QFont::operator=((QFont *)in_RDI,pQVar3);
        }
        else if (in_EDX != 0) {
          local_28 = &DAT_aaaaaaaaaaaaaaaa;
          local_20 = &DAT_aaaaaaaaaaaaaaaa;
          pQVar3 = QWidget::font((QWidget *)this_00);
          QFont::QFont((QFont *)&local_28,pQVar3);
          QFont::setResolveMask((QFont *)&local_28,in_EDX);
          QFont::resolve(local_38);
          QFont::operator=((QFont *)this_01,(QFont *)CONCAT17(bVar1,in_stack_ffffffffffffff58));
          QFont::~QFont(local_38);
          QFont::~QFont((QFont *)&local_28);
        }
      }
    }
  }
  QFont::setResolveMask((QFont *)in_RDI,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this_01;
  }
  __stack_chk_fail();
}

Assistant:

QFont QWidgetPrivate::naturalWidgetFont(uint inheritedMask) const
{
    Q_Q(const QWidget);

    const bool useStyleSheetPropagationInWidgetStyles =
        QCoreApplication::testAttribute(Qt::AA_UseStyleSheetPropagationInWidgetStyles);

    QFont naturalFont = QApplication::font(q);
    if ((!q->testAttribute(Qt::WA_StyleSheet) || useStyleSheetPropagationInWidgetStyles)
        && (!q->isWindow() || q->testAttribute(Qt::WA_WindowPropagation)
#if QT_CONFIG(graphicsview)
            || (extra && extra->proxyWidget)
#endif // QT_CONFIG(graphicsview)
            )) {
        if (QWidget *p = q->parentWidget()) {
            if (!p->testAttribute(Qt::WA_StyleSheet) || useStyleSheetPropagationInWidgetStyles) {
                if (!naturalFont.isCopyOf(QApplication::font())) {
                    if (inheritedMask != 0) {
                        QFont inheritedFont = p->font();
                        inheritedFont.setResolveMask(inheritedMask);
                        naturalFont = inheritedFont.resolve(naturalFont);
                    } // else nothing to do (naturalFont = naturalFont)
                } else {
                    naturalFont = p->font();
                }
            }
        }
#if QT_CONFIG(graphicsview)
        else if (extra && extra->proxyWidget) {
            if (inheritedMask != 0) {
                QFont inheritedFont = extra->proxyWidget->font();
                inheritedFont.setResolveMask(inheritedMask);
                naturalFont = inheritedFont.resolve(naturalFont);
            } // else nothing to do (naturalFont = naturalFont)
        }
#endif // QT_CONFIG(graphicsview)
    }
    naturalFont.setResolveMask(0);
    return naturalFont;
}